

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGParseGrammarContent(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr nodes)

{
  xmlChar *pxVar1;
  int iVar2;
  xmlChar *value;
  xmlRelaxNGDefinePtr_conflict payload;
  xmlRelaxNGDefinePtr_conflict pxVar3;
  xmlNodePtr pxVar4;
  xmlHashTablePtr pxVar5;
  void *pvVar6;
  void *pvVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  
  if (nodes == (xmlNodePtr)0x0) {
    xmlRngPErr(ctxt,(xmlNodePtr)0x0,0x40d,"grammar has no children\n",(xmlChar *)0x0,(xmlChar *)0x0)
    ;
    uVar9 = 0xffffffff;
  }
  else {
    uVar9 = 0;
    do {
      if ((((nodes->ns == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) ||
          (iVar2 = xmlStrEqual(nodes->name,(xmlChar *)"start"), iVar2 == 0)) ||
         (iVar2 = xmlStrEqual(nodes->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
         iVar2 == 0)) {
        if (((nodes->ns == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) ||
           ((iVar2 = xmlStrEqual(nodes->name,"define"), iVar2 == 0 ||
            (iVar2 = xmlStrEqual(nodes->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
            iVar2 == 0)))) {
          if (((nodes->ns == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) ||
             ((iVar2 = xmlStrEqual(nodes->name,(xmlChar *)"include"), iVar2 == 0 ||
              (iVar2 = xmlStrEqual(nodes->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0")
              , iVar2 == 0)))) {
            xmlRngPErr(ctxt,nodes,0x40c,"grammar has unexpected child %s\n",nodes->name,
                       (xmlChar *)0x0);
            uVar9 = 0xffffffff;
          }
          else {
            if (nodes->psvi == (void *)0x0) {
              iVar2 = 0x412;
              pcVar8 = "Include node has no data\n";
LAB_00185dc6:
              xmlRngPErr(ctxt,nodes,iVar2,pcVar8,(xmlChar *)0x0,(xmlChar *)0x0);
              uVar10 = 0xffffffff;
            }
            else {
              pxVar4 = xmlDocGetRootElement(*(xmlDoc **)((long)nodes->psvi + 0x10));
              if (pxVar4 == (xmlNodePtr)0x0) {
                iVar2 = 0x3fe;
                pcVar8 = "Include document is empty\n";
                goto LAB_00185dc6;
              }
              iVar2 = xmlStrEqual(pxVar4->name,"grammar");
              if (iVar2 == 0) {
                iVar2 = 0x40e;
                pcVar8 = "Include document root is not a grammar\n";
                goto LAB_00185dc6;
              }
              if (pxVar4->children == (xmlNodePtr)0x0) {
                uVar10 = 0;
              }
              else {
                iVar2 = xmlRelaxNGParseGrammarContent(ctxt,pxVar4->children);
                uVar10 = -(uint)(iVar2 != 0);
              }
              if (nodes->children != (xmlNodePtr)0x0) {
                iVar2 = xmlRelaxNGParseGrammarContent(ctxt,nodes->children);
                uVar10 = uVar10 | -(uint)(iVar2 != 0);
              }
            }
            uVar9 = uVar9 | -(uint)(uVar10 != 0);
          }
        }
        else {
          value = xmlGetProp(nodes,"name");
          if (value == (xmlChar *)0x0) {
            xmlRngPErr(ctxt,nodes,0x3f6,"define has no name\n",(xmlChar *)0x0,(xmlChar *)0x0);
          }
          else {
            xmlRelaxNGNormExtSpace(value);
            iVar2 = xmlValidateNCName(value,0);
            if (iVar2 != 0) {
              xmlRngPErr(ctxt,nodes,0x419,"define name \'%s\' is not an NCName\n",value,
                         (xmlChar *)0x0);
            }
            payload = xmlRelaxNGNewDefine(ctxt,nodes);
            if (payload == (xmlRelaxNGDefinePtr_conflict)0x0) {
              (*xmlFree)(value);
            }
            else {
              payload->type = XML_RELAXNG_DEF;
              payload->name = value;
              pxVar4 = nodes->children;
              if (pxVar4 == (xmlNodePtr)0x0) {
                xmlRngPErr(ctxt,nodes,0x3f4,"define has no children\n",(xmlChar *)0x0,(xmlChar *)0x0
                          );
              }
              else {
                pxVar1 = ctxt->define;
                ctxt->define = value;
                pxVar3 = xmlRelaxNGParsePatterns(ctxt,pxVar4,0);
                payload->content = pxVar3;
                ctxt->define = pxVar1;
              }
              if (ctxt->grammar->defs == (xmlHashTablePtr)0x0) {
                pxVar5 = xmlHashCreate(10);
                ctxt->grammar->defs = pxVar5;
              }
              pxVar5 = ctxt->grammar->defs;
              if (pxVar5 != (xmlHashTablePtr)0x0) {
                iVar2 = xmlHashAddEntry(pxVar5,value,payload);
                if (iVar2 < 0) {
                  pvVar6 = xmlHashLookup(ctxt->grammar->defs,value);
                  if (pvVar6 == (void *)0x0) {
                    pcVar8 = "Internal error on define aggregation of %s\n";
                    goto LAB_00185d9e;
                  }
                  do {
                    pvVar7 = pvVar6;
                    pvVar6 = *(void **)((long)pvVar7 + 0x58);
                  } while (pvVar6 != (void *)0x0);
                  *(xmlRelaxNGDefinePtr_conflict *)((long)pvVar7 + 0x58) = payload;
                }
                goto LAB_00185dea;
              }
              pcVar8 = "Could not create definition hash\n";
              value = (xmlChar *)0x0;
LAB_00185d9e:
              xmlRngPErr(ctxt,nodes,0x3f3,pcVar8,value,(xmlChar *)0x0);
            }
            uVar9 = 0xffffffff;
          }
        }
      }
      else if (nodes->children == (xmlNodePtr)0x0) {
        xmlRngPErr(ctxt,nodes,0x452,"start has no children\n",(xmlChar *)0x0,(xmlChar *)0x0);
      }
      else {
        iVar2 = xmlRelaxNGParseStart(ctxt,nodes->children);
        uVar9 = uVar9 | -(uint)(iVar2 != 0);
      }
LAB_00185dea:
      nodes = nodes->next;
    } while (nodes != (_xmlNode *)0x0);
  }
  return uVar9;
}

Assistant:

static int
xmlRelaxNGParseGrammarContent(xmlRelaxNGParserCtxtPtr ctxt,
                              xmlNodePtr nodes)
{
    int ret = 0, tmp;

    if (nodes == NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_EMPTY,
                   "grammar has no children\n", NULL, NULL);
        return (-1);
    }
    while (nodes != NULL) {
        if (IS_RELAXNG(nodes, "start")) {
            if (nodes->children == NULL) {
                xmlRngPErr(ctxt, nodes, XML_RNGP_START_EMPTY,
                           "start has no children\n", NULL, NULL);
            } else {
                tmp = xmlRelaxNGParseStart(ctxt, nodes->children);
                if (tmp != 0)
                    ret = -1;
            }
        } else if (IS_RELAXNG(nodes, "define")) {
            tmp = xmlRelaxNGParseDefine(ctxt, nodes);
            if (tmp != 0)
                ret = -1;
        } else if (IS_RELAXNG(nodes, "include")) {
            tmp = xmlRelaxNGParseInclude(ctxt, nodes);
            if (tmp != 0)
                ret = -1;
        } else {
            xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_CONTENT,
                       "grammar has unexpected child %s\n", nodes->name,
                       NULL);
            ret = -1;
        }
        nodes = nodes->next;
    }
    return (ret);
}